

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

void __thiscall Diligent::ThreadPoolImpl::ReprioritizeAllTasks(ThreadPoolImpl *this)

{
  vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  *this_00;
  pointer ppVar1;
  _Base_ptr p_Var2;
  const_iterator __position;
  vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  *__range2;
  pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo> *it;
  pointer __pos;
  float Priority;
  unique_lock<std::mutex> lock;
  float local_44;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->m_TasksQueueMtx;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  this_00 = &this->m_ReprioritizationList;
  std::
  vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ::_M_erase_at_end(this_00,(this->m_ReprioritizationList).
                            super__Vector_base<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  __position._M_node = (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)__position._M_node !=
         &(this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header) {
    local_44 = (float)(**(code **)(*(long *)__position._M_node[1]._M_parent + 0x48))();
    if (((float)__position._M_node[1]._M_color != local_44) ||
       (NAN((float)__position._M_node[1]._M_color) || NAN(local_44))) {
      std::
      vector<std::pair<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::allocator<std::pair<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
      ::emplace_back<float&,Diligent::ThreadPoolImpl::QueuedTaskInfo>
                ((vector<std::pair<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::allocator<std::pair<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                  *)this_00,&local_44,(QueuedTaskInfo *)&__position._M_node[1]._M_parent);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      std::
      _Rb_tree<float,_std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::_Select1st<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
      ::_M_erase_aux(&(this->m_TasksQueue)._M_t,__position);
      __position._M_node = p_Var2;
    }
    else {
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    }
  }
  __pos = (this->m_ReprioritizationList).
          super__Vector_base<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->m_ReprioritizationList).
           super__Vector_base<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__pos != ppVar1) {
    do {
      std::
      _Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
      ::_M_emplace_equal<float&,Diligent::ThreadPoolImpl::QueuedTaskInfo>
                ((_Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                  *)&this->m_TasksQueue,&__pos->first,&__pos->second);
      __pos = __pos + 1;
    } while (__pos != ppVar1);
    __pos = (this_00->
            super__Vector_base<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ::_M_erase_at_end(this_00,__pos);
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

ReprioritizeAllTasks() override final
    {
        std::unique_lock<std::mutex> lock{m_TasksQueueMtx};

        m_ReprioritizationList.clear();
        for (auto it = m_TasksQueue.begin(); it != m_TasksQueue.end();)
        {
            auto& TaskInfo = it->second;
            auto  Priority = TaskInfo.pTask->GetPriority();
            if (it->first != Priority)
            {
                m_ReprioritizationList.emplace_back(Priority, std::move(TaskInfo));
                it = m_TasksQueue.erase(it);
            }
            else
            {
                ++it;
            }
        }

        for (auto& it : m_ReprioritizationList)
        {
            m_TasksQueue.emplace(it.first, std::move(it.second));
        }

        m_ReprioritizationList.clear();
    }